

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O0

Expr remainder_builtin(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,
                      Expr *args,int argc)

{
  ulong uVar1;
  anon_union_8_8_707b72ea_for_Expr_1 aVar2;
  ulong uVar3;
  anon_union_8_8_707b72ea_for_Expr_1 aVar4;
  Expr *__ptr;
  Expr EVar5;
  Expr a;
  Expr b;
  Expr second;
  Expr first;
  Expr *values;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  
  if (argc < 2) {
    printf("remainder: too few arguments\n");
    exit(1);
  }
  if (2 < argc) {
    printf("remainder: too many arguments\n");
    exit(1);
  }
  __ptr = exec_eval_each(exec,callContext,args,argc);
  uVar1 = *(ulong *)__ptr;
  aVar2 = (anon_union_8_8_707b72ea_for_Expr_1)(__ptr->field_1).val_atom;
  uVar3 = *(ulong *)(__ptr + 1);
  aVar4 = (anon_union_8_8_707b72ea_for_Expr_1)__ptr[1].field_1.val_atom;
  free(__ptr);
  a._0_8_ = uVar1 & 0xffffffff;
  b._0_8_ = uVar3 & 0xffffffff;
  a.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)(anon_union_8_8_707b72ea_for_Expr_1)aVar2.val_atom
  ;
  b.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)(anon_union_8_8_707b72ea_for_Expr_1)aVar4.val_atom
  ;
  EVar5 = exec_remainder(exec,a,b);
  EVar5._4_4_ = 0;
  return EVar5;
}

Assistant:

BUILTIN_FUNC(remainder_builtin)
{
    if (argc < 2)
    {
        log("remainder: too few arguments");
        exit(1);
    }
    if (argc > 2)
    {
        log("remainder: too many arguments");
        exit(1);
    }
    Expr *values = exec_eval_each(exec, callContext, args, argc);

    Expr first = values[0];
    Expr second = values[1];
    free(values);

    return exec_remainder(exec, first, second);
}